

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_Constractor6_Test::TestBody(ConfidentialTxOut_Constractor6_Test *this)

{
  undefined8 lhs;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar;
  long local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  ConfidentialTxOut txout;
  ConfidentialAssetId local_260;
  ConfidentialValue local_238;
  ConfidentialNonce local_210;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d0;
  ElementsConfidentialAddress address;
  
  std::__cxx11::string::string
            ((string *)&txout,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,(allocator *)&gtest_ar_6);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&address,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  local_2c0 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_2b8 = extraout_DL;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&txout,&address,&exp_asset,(Amount *)&local_2c0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_6,&local_260)
  ;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  lhs = gtest_ar_1._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             (char *)lhs,(char *)gtest_ar_2._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xba,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&gtest_ar_6,&local_238);
  gtest_ar_2._0_8_ = cfd::core::ConfidentialValue::GetAmount();
  gtest_ar_2.message_.ptr_._0_1_ = extraout_DL_00;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_2c8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&gtest_ar,&local_2c8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_6);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",
             (char *)gtest_ar_1._0_8_,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_6);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbe,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&gtest_ar_6,&local_210);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetNonce().GetHex().c_str()",
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",
             (char *)gtest_ar_1._0_8_,
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar_6);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc0,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,&local_1d0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_),"");
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc1,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,&local_1e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_),"");
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_1._0_8_ = cfd::core::AbstractTxOut::GetValue();
  gtest_ar_1.message_.ptr_._0_1_ = extraout_DL_01;
  gtest_ar_2._0_8_ = cfd::core::Amount::GetSatoshiValue();
  gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_6,"txout.GetValue().GetSatoshiValue()","0",(long *)&gtest_ar_2,
             (int *)&gtest_ar);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor6) {
  // ConfidentialAssetId, ConfidentialValue
  ElementsConfidentialAddress address("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz");
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(address, exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
      "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(),
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}